

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::CheckImportedVariableInitialization(ValidationState_t *vstate)

{
  bool bVar1;
  spv_result_t sVar2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this;
  reference puVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  size_type sVar4;
  DiagnosticStream *this_01;
  DiagnosticStream local_218;
  Instruction *local_40;
  Instruction *variable_instr;
  _Node_iterator_base<unsigned_int,_false> _Stack_30;
  uint global_var_id;
  iterator __end2;
  iterator __begin2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2;
  ValidationState_t *vstate_local;
  
  this = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *)ValidationState_t::global_vars(vstate);
  __end2 = std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin(this);
  _Stack_30._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(this);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                       &stack0xffffffffffffffd0);
    if (!bVar1) {
      return SPV_SUCCESS;
    }
    puVar3 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end2);
    variable_instr._4_4_ = *puVar3;
    local_40 = ValidationState_t::FindDef(vstate,variable_instr._4_4_);
    this_00 = val::Instruction::words(local_40);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
    if ((sVar4 == 5) && (bVar1 = hasImportLinkageAttribute(variable_instr._4_4_,vstate), bVar1))
    break;
    std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end2);
  }
  ValidationState_t::diag(&local_218,vstate,SPV_ERROR_INVALID_ID,local_40);
  this_01 = DiagnosticStream::operator<<
                      (&local_218,
                       (char (*) [99])
                       "A module-scope OpVariable with initialization value cannot be marked with the Import Linkage Type."
                      );
  sVar2 = DiagnosticStream::operator_cast_to_spv_result_t(this_01);
  DiagnosticStream::~DiagnosticStream(&local_218);
  return sVar2;
}

Assistant:

spv_result_t CheckImportedVariableInitialization(ValidationState_t& vstate) {
  // According the SPIR-V Spec 2.16.1, it is illegal to initialize an imported
  // variable. This means that a module-scope OpVariable with initialization
  // value cannot be marked with the Import Linkage Type (import type id = 1).
  for (auto global_var_id : vstate.global_vars()) {
    // Initializer <id> is an optional argument for OpVariable. If initializer
    // <id> is present, the instruction will have 5 words.
    auto variable_instr = vstate.FindDef(global_var_id);
    if (variable_instr->words().size() == 5u &&
        hasImportLinkageAttribute(global_var_id, vstate)) {
      return vstate.diag(SPV_ERROR_INVALID_ID, variable_instr)
             << "A module-scope OpVariable with initialization value "
                "cannot be marked with the Import Linkage Type.";
    }
  }
  return SPV_SUCCESS;
}